

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stop_Freeze_R_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Stop_Freeze_R_PDU::Decode(Stop_Freeze_R_PDU *this,KDataStream *stream,bool ignoreHeader)

{
  KUINT16 KVar1;
  KException *this_00;
  KDataStream *pKVar2;
  int iVar3;
  allocator<char> local_41;
  KString local_40;
  byte local_19;
  KDataStream *pKStack_18;
  bool ignoreHeader_local;
  KDataStream *stream_local;
  Stop_Freeze_R_PDU *this_local;
  
  local_19 = ignoreHeader;
  pKStack_18 = stream;
  stream_local = (KDataStream *)this;
  KVar1 = KDataStream::GetBufferSize(stream);
  iVar3 = 0;
  if ((local_19 & 1) != 0) {
    iVar3 = 0xc;
  }
  if ((uint)KVar1 + iVar3 < 0x28) {
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"Decode",&local_41);
    KException::KException(this_00,&local_40,2);
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  Simulation_Management_Header::Decode
            ((Simulation_Management_Header *)this,pKStack_18,(bool)(local_19 & 1));
  pKVar2 = DATA_TYPE::operator>>
                     (pKStack_18,&(this->super_Stop_Freeze_PDU).m_RealWorldTime.super_DataTypeBase);
  pKVar2 = KDataStream::operator>>(pKVar2,&(this->super_Stop_Freeze_PDU).m_ui8Reason);
  pKVar2 = KDataStream::operator>>(pKVar2,&(this->super_Stop_Freeze_PDU).m_ui8FrozenBehaviour);
  pKVar2 = KDataStream::operator>>(pKVar2,&(this->super_Reliability_Header).m_ui8ReqRelSrv);
  pKVar2 = KDataStream::operator>>
                     (pKVar2,&(this->super_Stop_Freeze_PDU).super_Simulation_Management_Header.
                              super_Header.super_Header6.m_ui8Padding2);
  KDataStream::operator>>(pKVar2,&(this->super_Stop_Freeze_PDU).m_ui32RequestID);
  return;
}

Assistant:

void Stop_Freeze_R_PDU::Decode(KDataStream &stream, bool ignoreHeader /*= true*/ ) noexcept(false)
{
    if( ( stream.GetBufferSize() + ( ignoreHeader ? Header::HEADER6_PDU_SIZE : 0 ) ) < STOP_FREEZE_R_PDU_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    Simulation_Management_Header::Decode( stream, ignoreHeader );

    stream >> KDIS_STREAM m_RealWorldTime
           >> m_ui8Reason
           >> m_ui8FrozenBehaviour
           >> m_ui8ReqRelSrv
           >> m_ui8Padding2
           >> m_ui32RequestID;
}